

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCliqueTable.cpp
# Opt level: O1

void __thiscall
HighsCliqueTable::extractCliques
          (HighsCliqueTable *this,HighsMipSolver *mipsolver,bool transformRows)

{
  vector<double,_std::allocator<double>_> *pvVar1;
  vector<double,_std::allocator<double>_> *pvVar2;
  double dVar3;
  double dVar4;
  CliqueVar CVar5;
  HighsMipSolverData *pHVar6;
  HighsMipSolverData *pHVar7;
  pointer piVar8;
  int iVar9;
  HighsLp *pHVar10;
  ValueType *pVVar11;
  u64 uVar12;
  vector<double,_std::allocator<double>_> *pvVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  long lVar17;
  _Head_base<0UL,_unsigned_char_*,_false> _Var18;
  _Head_base<0UL,_unsigned_char_*,_false> _Var19;
  _Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_> _Var20;
  _Head_base<0UL,_unsigned_char_*,_false> _Var21;
  ulong uVar22;
  ulong in_R9;
  byte bVar23;
  long lVar24;
  int iVar25;
  bool bVar26;
  uint uVar27;
  long lVar28;
  _Head_base<0UL,_unsigned_char_*,_false> _Var29;
  HighsInt col_2;
  double local_150;
  HighsInt col;
  undefined4 uStack_144;
  double local_140;
  vector<signed_char,_std::allocator<signed_char>_> complementation;
  vector<double,_std::allocator<double>_> vals;
  vector<int,_std::allocator<int>_> inds;
  double local_c8;
  int local_a4;
  HighsHashTable<int,_double> entries;
  vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> clique;
  vector<int,_std::allocator<int>_> perm;
  
  inds.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  inds.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  inds.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  perm.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  perm.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  perm.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  complementation.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  complementation.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  complementation.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  clique.
  super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  clique.
  super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  clique.
  super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  HighsHashTable<int,_double>::HighsHashTable(&entries);
  pHVar10 = mipsolver->model_;
  if (pHVar10->num_row_ != 0) {
    pHVar6 = (mipsolver->mipdata_)._M_t.
             super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
             _M_t.
             super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
             super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
    pvVar1 = &(pHVar6->domain).col_lower_;
    pvVar2 = &(pHVar6->domain).col_upper_;
    uVar22 = 0;
    do {
      pHVar7 = (mipsolver->mipdata_)._M_t.
               super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
               _M_t.
               super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
               .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
      uVar14 = 2;
      if (*(int *)(*(long *)&(pHVar7->postSolveStack).origRowIndex.
                             super__Vector_base<int,_std::allocator<int>_>._M_impl + uVar22 * 4) <
          mipsolver->orig_model_->num_row_) {
        lVar28 = *(long *)&(pHVar7->ARstart_).super__Vector_base<int,_std::allocator<int>_>._M_impl;
        iVar16 = *(int *)(lVar28 + uVar22 * 4);
        lVar24 = (long)iVar16;
        iVar15 = *(int *)(lVar28 + 4 + uVar22 * 4);
        dVar3 = (pHVar10->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar22];
        if ((dVar3 != 1.0) || (NAN(dVar3))) {
          uVar14 = 0;
          if (!transformRows) goto LAB_002651fa;
        }
        else {
          if (clique.
              super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              clique.
              super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            clique.
            super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 clique.
                 super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                 ._M_impl.super__Vector_impl_data._M_start;
          }
          if (iVar15 == iVar16) {
LAB_0026487c:
            in_R9 = uVar22;
            addClique(this,mipsolver,
                      clique.
                      super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (HighsInt)
                      ((ulong)((long)clique.
                                     super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)clique.
                                    super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 2),
                      (bool)(-((mipsolver->model_->row_lower_).
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start[uVar22] == 1.0) & 1),
                      (HighsInt)uVar22);
            uVar27 = ((pHVar6->domain).infeasible_ ^ 1) * 3 + 1;
          }
          else {
            iVar25 = iVar15 - iVar16;
            bVar26 = true;
            lVar28 = lVar24;
            do {
              pHVar7 = (mipsolver->mipdata_)._M_t.
                       super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                       .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
              iVar9 = *(int *)(*(long *)&(pHVar7->ARindex_).
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl +
                              lVar28 * 4);
              lVar17 = (long)iVar9;
              _col = (double)CONCAT44(uStack_144,iVar9);
              dVar3 = *(double *)
                       (*(long *)&(pHVar6->domain).col_upper_.
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl +
                       lVar17 * 8);
              if ((dVar3 != 0.0) || (NAN(dVar3))) {
LAB_002647b0:
                iVar9 = 5;
                if (((((*(char *)(*(long *)&(((pHVar6->domain).mipsolver)->model_->integrality_).
                                            super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>
                                            ._M_impl + lVar17) == '\0') ||
                      (dVar3 = *(double *)
                                (*(long *)&(pHVar6->domain).col_lower_.
                                           super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl + lVar17 * 8), dVar3 != 0.0)) || (NAN(dVar3))) ||
                    (((dVar3 = *(double *)
                                (*(long *)&(pHVar6->domain).col_upper_.
                                           super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl + lVar17 * 8), dVar3 != 1.0 || (NAN(dVar3))) ||
                     (dVar3 = *(double *)
                               (*(long *)&(pHVar7->ARvalue_).
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl + lVar28 * 8), dVar3 != 1.0)))) || (NAN(dVar3))) {
                  bVar26 = false;
                }
                else {
                  local_150 = (double)CONCAT44(local_150._4_4_,1);
                  std::
                  vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>::
                  emplace_back<int&,int>
                            ((vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>
                              *)&clique,&col,(int *)&local_150);
                  iVar9 = 0;
                }
              }
              else {
                dVar3 = *(double *)
                         (*(long *)&(pHVar6->domain).col_lower_.
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl +
                         lVar17 * 8);
                iVar9 = 7;
                if ((dVar3 != 0.0) || (NAN(dVar3))) goto LAB_002647b0;
              }
              if ((iVar9 != 7) && (iVar9 != 0)) break;
              lVar28 = lVar28 + 1;
              iVar25 = iVar25 + -1;
            } while (iVar25 != 0);
            uVar27 = 0;
            if (bVar26) goto LAB_0026487c;
          }
          uVar14 = uVar27;
          if (uVar27 == 0) {
            uVar14 = 0;
          }
          if (uVar27 != 0 || !transformRows) goto LAB_002651fa;
        }
        uVar14 = 0;
        if (this->numEntries < this->maxEntries) {
          local_140 = 0.0;
          if (iVar16 != iVar15) {
            local_140 = 0.0;
            do {
              pHVar7 = (mipsolver->mipdata_)._M_t.
                       super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                       .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
              iVar16 = *(int *)(*(long *)&(pHVar7->ARindex_).
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl +
                               lVar24 * 4);
              _col = (double)CONCAT44(uStack_144,iVar16);
              local_c8 = *(double *)
                          (*(long *)&(pHVar7->ARvalue_).
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl +
                          lVar24 * 8);
              piVar8 = (this->colsubstituted).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
              iVar16 = piVar8[iVar16];
              if (iVar16 != 0) {
                do {
                  CVar5 = (this->substitutions).
                          super__Vector_base<HighsCliqueTable::Substitution,_std::allocator<HighsCliqueTable::Substitution>_>
                          ._M_impl.super__Vector_impl_data._M_start[(long)iVar16 + -1].replace;
                  if (-1 < (int)CVar5) {
                    local_140 = local_140 + local_c8;
                    local_c8 = -local_c8;
                  }
                  _col = (double)(CONCAT44(uStack_144,CVar5) & 0xffffffff7fffffff);
                  iVar16 = piVar8[(uint)CVar5 & 0x7fffffff];
                } while (iVar16 != 0);
              }
              pVVar11 = HighsHashTable<int,_double>::operator[](&entries,&col);
              *pVVar11 = local_c8 + *pVVar11;
              lVar24 = lVar24 + 1;
            } while (iVar15 != (int)lVar24);
          }
          local_c8 = (mipsolver->model_->row_upper_).
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar22];
          if (local_c8 < INFINITY) {
            if (inds.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_finish !=
                inds.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start) {
              inds.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_finish = inds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start;
            }
            if (vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start) {
              vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
            }
            if (complementation.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                _M_impl.super__Vector_impl_data._M_finish !=
                complementation.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                _M_impl.super__Vector_impl_data._M_start) {
              complementation.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   complementation.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
            }
            if (entries.numElements == 0) {
              _Var29._M_head_impl =
                   (uchar *)((long)entries.metadata._M_t.
                                   super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                   .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl +
                            entries.tableSizeMask + 1);
              lVar28 = (long)entries.entries._M_t.
                             super___uniq_ptr_impl<HighsHashTableEntry<int,_double>,_HighsHashTable<int,_double>::OpNewDeleter>
                             ._M_t.
                             super__Tuple_impl<0UL,_HighsHashTableEntry<int,_double>_*,_HighsHashTable<int,_double>::OpNewDeleter>
                             .super__Head_base<0UL,_HighsHashTableEntry<int,_double>_*,_false>.
                             _M_head_impl + (entries.tableSizeMask + 1) * 0x10;
              _Var21._M_head_impl = _Var29._M_head_impl;
            }
            else {
              _Var29._M_head_impl =
                   (uchar *)(entries.tableSizeMask +
                             (long)entries.metadata._M_t.
                                   super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                   .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + 1);
              lVar28 = (long)entries.entries._M_t.
                             super___uniq_ptr_impl<HighsHashTableEntry<int,_double>,_HighsHashTable<int,_double>::OpNewDeleter>
                             ._M_t.
                             super__Tuple_impl<0UL,_HighsHashTableEntry<int,_double>_*,_HighsHashTable<int,_double>::OpNewDeleter>
                             .super__Head_base<0UL,_HighsHashTableEntry<int,_double>_*,_false>.
                             _M_head_impl + (entries.tableSizeMask + 1) * 0x10;
              _Var18._M_head_impl =
                   (uchar *)entries.metadata._M_t.
                            super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                            .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
              for (uVar12 = entries.tableSizeMask;
                  (_Var21._M_head_impl = _Var18._M_head_impl, -1 < (char)*_Var18._M_head_impl &&
                  (_Var21._M_head_impl = _Var29._M_head_impl, uVar12 != 0)); uVar12 = uVar12 - 1) {
                _Var18._M_head_impl = _Var18._M_head_impl + 1;
              }
            }
            local_c8 = local_c8 - local_140;
            if (_Var21._M_head_impl ==
                (uchar *)((long)entries.metadata._M_t.
                                super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl +
                          entries.tableSizeMask + 1)) {
              bVar26 = true;
            }
            else {
              _Var18._M_head_impl =
                   (uchar *)((long)entries.metadata._M_t.
                                   super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                   .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl +
                            entries.tableSizeMask);
              local_a4 = 0;
              bVar23 = 0;
              do {
                lVar17 = ((long)_Var21._M_head_impl - (long)_Var29._M_head_impl) * 0x10;
                col_2 = *(int *)(lVar28 + lVar17);
                lVar24 = (long)col_2;
                _col = *(double *)(lVar28 + 8 + lVar17);
                iVar16 = 0xc;
                if (((mipsolver->mipdata_)._M_t.
                     super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                     .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->epsilon <=
                    ABS(_col)) {
                  uVar14 = 0;
                  if (((*(char *)(*(long *)&(((pHVar6->domain).mipsolver)->model_->integrality_).
                                            super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>
                                            ._M_impl + lVar24) != '\0') &&
                      (dVar3 = *(double *)
                                (*(long *)&(pHVar6->domain).col_lower_.
                                           super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl + lVar24 * 8), uVar14 = 0, dVar3 == 0.0)) &&
                     (!NAN(dVar3))) {
                    uVar14 = -(uint)(*(double *)
                                      (*(long *)&(pHVar6->domain).col_upper_.
                                                 super__Vector_base<double,_std::allocator<double>_>
                                                 ._M_impl + lVar24 * 8) == 1.0) & 1;
                  }
                  local_a4 = local_a4 + uVar14;
                  if (0.0 <= _col) {
                    if (*(double *)
                         (*(long *)&(pvVar1->super__Vector_base<double,_std::allocator<double>_>).
                                    _M_impl + lVar24 * 8) <= -INFINITY) goto LAB_00264c0f;
                    if (vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish ==
                        vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage) {
                      std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                                ((vector<double,std::allocator<double>> *)&vals,
                                 (iterator)
                                 vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_finish,(double *)&col);
                    }
                    else {
                      *vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish = _col;
                      vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish =
                           vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_finish + 1;
                    }
                    if (inds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish ==
                        inds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage) {
                      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                                ((vector<int,std::allocator<int>> *)&inds,
                                 (iterator)
                                 inds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish,&col_2);
                    }
                    else {
                      *inds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish = col_2;
                      inds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish =
                           inds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish + 1;
                    }
                    local_150 = (double)CONCAT71(local_150._1_7_,1);
                    pvVar13 = pvVar1;
                    if (complementation.
                        super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                        super__Vector_impl_data._M_finish ==
                        complementation.
                        super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage) {
                      std::vector<signed_char,_std::allocator<signed_char>_>::
                      _M_realloc_insert<signed_char>
                                (&complementation,
                                 (iterator)
                                 complementation.
                                 super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish,(char *)&local_150);
                    }
                    else {
                      *complementation.super__Vector_base<signed_char,_std::allocator<signed_char>_>
                       ._M_impl.super__Vector_impl_data._M_finish = '\x01';
                      complementation.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish =
                           complementation.
                           super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                           super__Vector_impl_data._M_finish + 1;
                    }
                  }
                  else {
                    if (INFINITY <=
                        *(double *)
                         (*(long *)&(pvVar2->super__Vector_base<double,_std::allocator<double>_>).
                                    _M_impl + lVar24 * 8)) {
LAB_00264c0f:
                      bVar23 = 1;
                      iVar16 = 0xb;
                      goto LAB_00264d3e;
                    }
                    local_150 = -_col;
                    if (vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish ==
                        vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage) {
                      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                                (&vals,(iterator)
                                       vals.super__Vector_base<double,_std::allocator<double>_>.
                                       _M_impl.super__Vector_impl_data._M_finish,&local_150);
                    }
                    else {
                      *vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish = local_150;
                      vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish =
                           vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_finish + 1;
                    }
                    if (inds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish ==
                        inds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage) {
                      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                                ((vector<int,std::allocator<int>> *)&inds,
                                 (iterator)
                                 inds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish,&col_2);
                    }
                    else {
                      *inds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish = col_2;
                      inds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish =
                           inds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish + 1;
                    }
                    local_150 = (double)CONCAT71(local_150._1_7_,0xff);
                    pvVar13 = pvVar2;
                    if (complementation.
                        super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                        super__Vector_impl_data._M_finish ==
                        complementation.
                        super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage) {
                      std::vector<signed_char,_std::allocator<signed_char>_>::
                      _M_realloc_insert<signed_char>
                                (&complementation,
                                 (iterator)
                                 complementation.
                                 super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish,(char *)&local_150);
                    }
                    else {
                      *complementation.super__Vector_base<signed_char,_std::allocator<signed_char>_>
                       ._M_impl.super__Vector_impl_data._M_finish = -1;
                      complementation.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish =
                           complementation.
                           super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                           super__Vector_impl_data._M_finish + 1;
                    }
                  }
                  local_c8 = local_c8 -
                             _col * *(double *)
                                     (*(long *)&(pvVar13->
                                                super__Vector_base<double,_std::allocator<double>_>)
                                                ._M_impl + (long)col_2 * 8);
                  iVar16 = 0;
                }
LAB_00264d3e:
                if ((iVar16 != 0xc) && (iVar16 != 0)) break;
                do {
                  _Var20.super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
                       (_Head_base<0UL,_unsigned_char_*,_false>)
                       (_Head_base<0UL,_unsigned_char_*,_false>)_Var21._M_head_impl;
                  _Var19._M_head_impl =
                       (uchar *)((long)_Var20.super__Head_base<0UL,_unsigned_char_*,_false>.
                                       _M_head_impl + 1);
                  _Var21._M_head_impl = _Var29._M_head_impl;
                  if (_Var19._M_head_impl == _Var29._M_head_impl) break;
                  _Var21._M_head_impl = _Var19._M_head_impl;
                } while (-1 < (char)*_Var19._M_head_impl);
              } while (_Var20.super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl !=
                       (_Head_base<0UL,_unsigned_char_*,_false>)_Var18._M_head_impl);
              bVar26 = (bool)(bVar23 | local_a4 == 0);
            }
            if (!bVar26) {
              extractCliques(this,mipsolver,&inds,&vals,&complementation,local_c8,(HighsInt)in_R9,
                             &perm,&clique,
                             ((mipsolver->mipdata_)._M_t.
                              super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                              .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->
                             feastol);
              uVar14 = 1;
              if ((pHVar6->domain).infeasible_ != false) goto LAB_002651fa;
            }
          }
          dVar3 = (mipsolver->model_->row_lower_).
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar22];
          if (-INFINITY < dVar3) {
            if (inds.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_finish !=
                inds.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start) {
              inds.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_finish = inds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start;
            }
            if (vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start) {
              vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
            }
            if (complementation.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                _M_impl.super__Vector_impl_data._M_finish !=
                complementation.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                _M_impl.super__Vector_impl_data._M_start) {
              complementation.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   complementation.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
            }
            if (entries.numElements == 0) {
              _Var29._M_head_impl =
                   (uchar *)((long)entries.metadata._M_t.
                                   super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                   .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl +
                            entries.tableSizeMask + 1);
              lVar28 = (long)entries.entries._M_t.
                             super___uniq_ptr_impl<HighsHashTableEntry<int,_double>,_HighsHashTable<int,_double>::OpNewDeleter>
                             ._M_t.
                             super__Tuple_impl<0UL,_HighsHashTableEntry<int,_double>_*,_HighsHashTable<int,_double>::OpNewDeleter>
                             .super__Head_base<0UL,_HighsHashTableEntry<int,_double>_*,_false>.
                             _M_head_impl + (entries.tableSizeMask + 1) * 0x10;
              _Var21._M_head_impl = _Var29._M_head_impl;
            }
            else {
              _Var29._M_head_impl =
                   (uchar *)((long)entries.metadata._M_t.
                                   super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                   .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl +
                             entries.tableSizeMask + 1);
              lVar28 = (long)entries.entries._M_t.
                             super___uniq_ptr_impl<HighsHashTableEntry<int,_double>,_HighsHashTable<int,_double>::OpNewDeleter>
                             ._M_t.
                             super__Tuple_impl<0UL,_HighsHashTableEntry<int,_double>_*,_HighsHashTable<int,_double>::OpNewDeleter>
                             .super__Head_base<0UL,_HighsHashTableEntry<int,_double>_*,_false>.
                             _M_head_impl + (entries.tableSizeMask + 1) * 0x10;
              _Var18._M_head_impl =
                   (uchar *)entries.metadata._M_t.
                            super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                            .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
              for (uVar12 = entries.tableSizeMask;
                  (_Var21._M_head_impl = _Var18._M_head_impl, -1 < (char)*_Var18._M_head_impl &&
                  (_Var21._M_head_impl = _Var29._M_head_impl, uVar12 != 0)); uVar12 = uVar12 - 1) {
                _Var18._M_head_impl = _Var18._M_head_impl + 1;
              }
            }
            local_140 = local_140 - dVar3;
            if (_Var21._M_head_impl ==
                (uchar *)((long)entries.metadata._M_t.
                                super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl +
                          entries.tableSizeMask + 1)) {
              bVar26 = true;
            }
            else {
              _Var18._M_head_impl =
                   (uchar *)((long)entries.metadata._M_t.
                                   super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                   .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl +
                            entries.tableSizeMask);
              iVar16 = 0;
              bVar23 = 0;
              do {
                lVar17 = ((long)_Var21._M_head_impl - (long)_Var29._M_head_impl) * 0x10;
                col_2 = *(int *)(lVar28 + lVar17);
                lVar24 = (long)col_2;
                dVar3 = *(double *)(lVar28 + 8 + lVar17);
                _col = -dVar3;
                iVar15 = 0xe;
                if (((mipsolver->mipdata_)._M_t.
                     super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                     .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->epsilon <=
                    ABS(dVar3)) {
                  uVar14 = 0;
                  if (((*(char *)(*(long *)&(((pHVar6->domain).mipsolver)->model_->integrality_).
                                            super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>
                                            ._M_impl + lVar24) != '\0') &&
                      (dVar4 = *(double *)
                                (*(long *)&(pHVar6->domain).col_lower_.
                                           super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl + lVar24 * 8), uVar14 = 0, dVar4 == 0.0)) &&
                     (!NAN(dVar4))) {
                    uVar14 = -(uint)(*(double *)
                                      (*(long *)&(pHVar6->domain).col_upper_.
                                                 super__Vector_base<double,_std::allocator<double>_>
                                                 ._M_impl + lVar24 * 8) == 1.0) & 1;
                  }
                  iVar16 = iVar16 + uVar14;
                  if (dVar3 <= 0.0) {
                    if (*(double *)
                         (*(long *)&(pvVar1->super__Vector_base<double,_std::allocator<double>_>).
                                    _M_impl + lVar24 * 8) <= -INFINITY) goto LAB_0026500e;
                    if (vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish ==
                        vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage) {
                      std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                                ((vector<double,std::allocator<double>> *)&vals,
                                 (iterator)
                                 vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_finish,(double *)&col);
                    }
                    else {
                      *vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish = _col;
                      vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish =
                           vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_finish + 1;
                    }
                    if (inds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish ==
                        inds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage) {
                      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                                ((vector<int,std::allocator<int>> *)&inds,
                                 (iterator)
                                 inds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish,&col_2);
                    }
                    else {
                      *inds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish = col_2;
                      inds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish =
                           inds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish + 1;
                    }
                    local_150 = (double)CONCAT71(local_150._1_7_,1);
                    pvVar13 = pvVar1;
                    if (complementation.
                        super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                        super__Vector_impl_data._M_finish ==
                        complementation.
                        super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage) {
                      std::vector<signed_char,_std::allocator<signed_char>_>::
                      _M_realloc_insert<signed_char>
                                (&complementation,
                                 (iterator)
                                 complementation.
                                 super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish,(char *)&local_150);
                    }
                    else {
                      *complementation.super__Vector_base<signed_char,_std::allocator<signed_char>_>
                       ._M_impl.super__Vector_impl_data._M_finish = '\x01';
                      complementation.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish =
                           complementation.
                           super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                           super__Vector_impl_data._M_finish + 1;
                    }
                  }
                  else {
                    if (INFINITY <=
                        *(double *)
                         (*(long *)&(pvVar2->super__Vector_base<double,_std::allocator<double>_>).
                                    _M_impl + lVar24 * 8)) {
LAB_0026500e:
                      bVar23 = 1;
                      iVar15 = 0xd;
                      goto LAB_00265137;
                    }
                    local_150 = dVar3;
                    if (vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish ==
                        vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage) {
                      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                                (&vals,(iterator)
                                       vals.super__Vector_base<double,_std::allocator<double>_>.
                                       _M_impl.super__Vector_impl_data._M_finish,&local_150);
                    }
                    else {
                      *vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish = dVar3;
                      vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish =
                           vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_finish + 1;
                    }
                    if (inds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish ==
                        inds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage) {
                      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                                ((vector<int,std::allocator<int>> *)&inds,
                                 (iterator)
                                 inds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish,&col_2);
                    }
                    else {
                      *inds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish = col_2;
                      inds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish =
                           inds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish + 1;
                    }
                    local_150 = (double)CONCAT71(local_150._1_7_,0xff);
                    pvVar13 = pvVar2;
                    if (complementation.
                        super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                        super__Vector_impl_data._M_finish ==
                        complementation.
                        super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage) {
                      std::vector<signed_char,_std::allocator<signed_char>_>::
                      _M_realloc_insert<signed_char>
                                (&complementation,
                                 (iterator)
                                 complementation.
                                 super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish,(char *)&local_150);
                    }
                    else {
                      *complementation.super__Vector_base<signed_char,_std::allocator<signed_char>_>
                       ._M_impl.super__Vector_impl_data._M_finish = -1;
                      complementation.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish =
                           complementation.
                           super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                           super__Vector_impl_data._M_finish + 1;
                    }
                  }
                  local_140 = local_140 -
                              _col * *(double *)
                                      (*(long *)&(pvVar13->
                                                 super__Vector_base<double,_std::allocator<double>_>
                                                 )._M_impl + (long)col_2 * 8);
                  iVar15 = 0;
                }
LAB_00265137:
                if ((iVar15 != 0xe) && (iVar15 != 0)) break;
                do {
                  _Var20.super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
                       (_Head_base<0UL,_unsigned_char_*,_false>)
                       (_Head_base<0UL,_unsigned_char_*,_false>)_Var21._M_head_impl;
                  _Var19._M_head_impl =
                       (uchar *)((long)_Var20.super__Head_base<0UL,_unsigned_char_*,_false>.
                                       _M_head_impl + 1);
                  _Var21._M_head_impl = _Var29._M_head_impl;
                  if (_Var19._M_head_impl == _Var29._M_head_impl) break;
                  _Var21._M_head_impl = _Var19._M_head_impl;
                } while (-1 < (char)*_Var19._M_head_impl);
              } while (_Var20.super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl !=
                       (_Head_base<0UL,_unsigned_char_*,_false>)_Var18._M_head_impl);
              bVar26 = (bool)(bVar23 | iVar16 == 0);
            }
            if (!bVar26) {
              extractCliques(this,mipsolver,&inds,&vals,&complementation,local_140,(HighsInt)in_R9,
                             &perm,&clique,
                             ((mipsolver->mipdata_)._M_t.
                              super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                              .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->
                             feastol);
              uVar14 = 1;
              if ((pHVar6->domain).infeasible_ != false) goto LAB_002651fa;
            }
          }
          uVar14 = 0;
          HighsHashTable<int,_double>::clear(&entries);
        }
      }
LAB_002651fa:
      if ((uVar14 & 3) != 0) break;
      uVar22 = uVar22 + 1;
      pHVar10 = mipsolver->model_;
    } while (uVar22 != (uint)pHVar10->num_row_);
  }
  HighsHashTable<int,_double>::~HighsHashTable(&entries);
  if (clique.
      super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(clique.
                    super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (complementation.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(complementation.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (perm.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start !=
      (pointer)0x0) {
    operator_delete(perm.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (inds.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start !=
      (pointer)0x0) {
    operator_delete(inds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void HighsCliqueTable::extractCliques(HighsMipSolver& mipsolver,
                                      bool transformRows) {
  std::vector<HighsInt> inds;
  std::vector<double> vals;
  std::vector<HighsInt> perm;
  std::vector<int8_t> complementation;
  std::vector<CliqueVar> clique;
  HighsHashTable<HighsInt, double> entries;
  double offset;

  double rhs;

  HighsDomain& globaldom = mipsolver.mipdata_->domain;

  for (HighsInt i = 0; i != mipsolver.numRow(); ++i) {
    HighsInt start = mipsolver.mipdata_->ARstart_[i];
    HighsInt end = mipsolver.mipdata_->ARstart_[i + 1];

    if (mipsolver.mipdata_->postSolveStack.getOrigRowIndex(i) >=
        mipsolver.orig_model_->num_row_)
      break;

    // catch set packing and partitioning constraints that already have the form
    // of a clique without transformations and add those cliques with the rows
    // being recorded
    if (mipsolver.rowUpper(i) == 1.0) {
      bool issetppc = true;

      clique.clear();

      for (HighsInt j = start; j != end; ++j) {
        HighsInt col = mipsolver.mipdata_->ARindex_[j];
        if (globaldom.col_upper_[col] == 0.0 &&
            globaldom.col_lower_[col] == 0.0)
          continue;
        if (!globaldom.isBinary(col)) {
          issetppc = false;
          break;
        }

        if (mipsolver.mipdata_->ARvalue_[j] != 1.0) {
          issetppc = false;
          break;
        }

        clique.emplace_back(col, 1);
      }

      if (issetppc) {
        bool equality = mipsolver.rowLower(i) == 1.0;
        addClique(mipsolver, clique.data(), clique.size(), equality, i);
        if (globaldom.infeasible()) return;
        continue;
      }
    }
    if (!transformRows || isFull()) continue;

    offset = 0;
    for (HighsInt j = start; j != end; ++j) {
      HighsInt col = mipsolver.mipdata_->ARindex_[j];
      double val = mipsolver.mipdata_->ARvalue_[j];

      resolveSubstitution(col, val, offset);
      entries[col] += val;
    }

    if (mipsolver.rowUpper(i) != kHighsInf) {
      rhs = mipsolver.rowUpper(i) - offset;
      inds.clear();
      vals.clear();
      complementation.clear();
      bool freevar = false;
      HighsInt nbin = 0;

      for (const auto& entry : entries) {
        HighsInt col = entry.key();
        double val = entry.value();

        if (std::abs(val) < mipsolver.mipdata_->epsilon) continue;

        if (globaldom.isBinary(col)) ++nbin;

        if (val < 0) {
          if (globaldom.col_upper_[col] == kHighsInf) {
            freevar = true;
            break;
          }

          vals.push_back(-val);
          inds.push_back(col);
          complementation.push_back(-1);
          rhs -= val * globaldom.col_upper_[col];
        } else {
          if (globaldom.col_lower_[col] == -kHighsInf) {
            freevar = true;
            break;
          }

          vals.push_back(val);
          inds.push_back(col);
          complementation.push_back(1);
          rhs -= val * globaldom.col_lower_[col];
        }
      }

      if (!freevar && nbin != 0) {
        // printf("extracting cliques from this row:\n");
        // printRow(globaldom, inds.data(), vals.data(), inds.size(),
        //         -kHighsInf, rhs);
        extractCliques(mipsolver, inds, vals, complementation, rhs, nbin, perm,
                       clique, mipsolver.mipdata_->feastol);
        if (globaldom.infeasible()) return;
      }
    }

    if (mipsolver.rowLower(i) != -kHighsInf) {
      rhs = -mipsolver.rowLower(i) + offset;
      inds.clear();
      vals.clear();
      complementation.clear();
      bool freevar = false;
      HighsInt nbin = 0;

      for (const auto& entry : entries) {
        HighsInt col = entry.key();
        double val = -entry.value();
        if (std::abs(val) < mipsolver.mipdata_->epsilon) continue;

        if (globaldom.isBinary(col)) ++nbin;

        if (val < 0) {
          if (globaldom.col_upper_[col] == kHighsInf) {
            freevar = true;
            break;
          }

          vals.push_back(-val);
          inds.push_back(col);
          complementation.push_back(-1);
          rhs -= val * globaldom.col_upper_[col];
        } else {
          if (globaldom.col_lower_[col] == -kHighsInf) {
            freevar = true;
            break;
          }

          vals.push_back(val);
          inds.push_back(col);
          complementation.push_back(1);
          rhs -= val * globaldom.col_lower_[col];
        }
      }

      if (!freevar && nbin != 0) {
        // printf("extracting cliques from this row:\n");
        // printRow(globaldom, inds.data(), vals.data(), inds.size(),
        //         -kHighsInf, rhs);
        extractCliques(mipsolver, inds, vals, complementation, rhs, nbin, perm,
                       clique, mipsolver.mipdata_->feastol);
        if (globaldom.infeasible()) return;
      }
    }

    entries.clear();
  }
}